

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O3

float64 helper_rsqrte_f64_aarch64(float64 input,void *fpstp)

{
  int iVar1;
  float64 fVar2;
  ulong uVar3;
  uint64_t uVar4;
  int f64_exp;
  uint local_1c;
  
  fVar2 = float64_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  local_1c = (uint)(fVar2 >> 0x34) & 0x7ff;
  uVar3 = fVar2 & 0x7fffffffffffffff;
  if (uVar3 < 0x7ff0000000000001) {
    if (uVar3 == 0) {
      float_raise_aarch64('\x04',(float_status *)fpstp);
      fVar2 = fVar2 | 0x7ff0000000000000;
    }
    else {
      if ((long)fVar2 < 0) {
        float_raise_aarch64('\x01',(float_status *)fpstp);
        goto LAB_0068c7b6;
      }
      if (uVar3 == 0x7ff0000000000000) {
        fVar2 = 0;
      }
      else {
        uVar4 = recip_sqrt_estimate((int *)&local_1c,0xbfc,fVar2 & 0xfffffffffffff);
        fVar2 = uVar4 & 0xff00000000000 | (ulong)(local_1c & 0x7ff) << 0x34;
      }
    }
  }
  else {
    iVar1 = float64_is_signaling_nan_aarch64(fVar2,(float_status *)fpstp);
    if (iVar1 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      fVar2 = float64_silence_nan_aarch64(fVar2,(float_status *)fpstp);
    }
    if (*(char *)((long)fpstp + 6) != '\0') {
LAB_0068c7b6:
      fVar2 = float64_default_nan_aarch64((float_status *)fpstp);
      return fVar2;
    }
  }
  return fVar2;
}

Assistant:

float64 HELPER(rsqrte_f64)(float64 input, void *fpstp)
{
    float_status *s = fpstp;
    float64 f64 = float64_squash_input_denormal(input, s);
    uint64_t val = float64_val(f64);
    bool f64_sign = float64_is_neg(f64);
    int f64_exp = extract64(val, 52, 11);
    uint64_t f64_frac = extract64(val, 0, 52);

    if (float64_is_any_nan(f64)) {
        float64 nan = f64;
        if (float64_is_signaling_nan(f64, s)) {
            float_raise(float_flag_invalid, s);
            nan = float64_silence_nan(f64, s);
        }
        if (s->default_nan_mode) {
            nan =  float64_default_nan(s);
        }
        return nan;
    } else if (float64_is_zero(f64)) {
        float_raise(float_flag_divbyzero, s);
        return float64_set_sign(float64_infinity, float64_is_neg(f64));
    } else if (float64_is_neg(f64)) {
        float_raise(float_flag_invalid, s);
        return float64_default_nan(s);
    } else if (float64_is_infinity(f64)) {
        return float64_zero;
    }

    f64_frac = recip_sqrt_estimate(&f64_exp, 3068, f64_frac);

    /* result = sign : result_exp<4:0> : estimate<7:0> : Zeros(44) */
    val = deposit64(0, 61, 1, f64_sign);
    val = deposit64(val, 52, 11, f64_exp);
    val = deposit64(val, 44, 8, extract64(f64_frac, 52 - 8, 8));
    return make_float64(val);
}